

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorShower::setHsv(QColorShower *this,int h,int s,int v)

{
  QRgb QVar1;
  uint in_ECX;
  uint in_EDX;
  int in_ESI;
  QColorShower *in_RDI;
  long in_FS_OFFSET;
  QColor c;
  QString *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int i;
  QColSpinBox *this_00;
  QColSpinBox *in_stack_ffffffffffffff98;
  QColorShower *this_01;
  QColorShower *this_02;
  undefined1 local_30 [24];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  i = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((-2 < in_ESI) && (in_EDX < 0x100)) && (in_ECX < 0x100)) {
    in_RDI->rgbOriginal = false;
    in_RDI->hue = in_ESI;
    in_RDI->val = in_ECX;
    in_RDI->sat = in_EDX;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QColor::QColor((QColor *)0x736c44);
    QColor::setHsv((int)&local_18,in_RDI->hue,in_RDI->sat,in_RDI->val);
    QVar1 = QColor::rgb();
    in_RDI->curCol = QVar1;
    QColSpinBox::setValue(in_stack_ffffffffffffff98,i);
    QColSpinBox::setValue(in_stack_ffffffffffffff98,i);
    QColSpinBox::setValue(in_stack_ffffffffffffff98,i);
    this_00 = in_RDI->rEd;
    QVar1 = currentColor(in_RDI);
    qRed(QVar1);
    QColSpinBox::setValue(in_stack_ffffffffffffff98,(int)((ulong)this_00 >> 0x20));
    this_01 = (QColorShower *)in_RDI->gEd;
    QVar1 = currentColor(in_RDI);
    qGreen(QVar1);
    QColSpinBox::setValue((QColSpinBox *)this_01,(int)((ulong)this_00 >> 0x20));
    QVar1 = currentColor(in_RDI);
    qBlue(QVar1);
    QColSpinBox::setValue((QColSpinBox *)this_01,(int)((ulong)this_00 >> 0x20));
    this_02 = (QColorShower *)in_RDI->htEd;
    QColor::name((NameFormat)local_30);
    QLineEdit::setText((QLineEdit *)this_00,in_stack_ffffffffffffff88);
    QString::~QString((QString *)0x736d63);
    showCurrentColor(this_01);
    updateQColor(this_02);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorShower::setHsv(int h, int s, int v)
{
    if (h < -1 || (uint)s > 255 || (uint)v > 255)
        return;

    rgbOriginal = false;
    hue = h; val = v; sat = s;
    QColor c;
    c.setHsv(hue, sat, val);
    curCol = c.rgb();

    hEd->setValue(hue);
    sEd->setValue(sat);
    vEd->setValue(val);

    rEd->setValue(qRed(currentColor()));
    gEd->setValue(qGreen(currentColor()));
    bEd->setValue(qBlue(currentColor()));

    htEd->setText(c.name());

    showCurrentColor();
    updateQColor();
}